

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UintTypes.cpp
# Opt level: O3

bool jbcoin::to_currency(Currency *currency,string *code)

{
  size_type sVar1;
  pointer pcVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  undefined1 *puVar6;
  value_type_conflict1 *__val;
  size_type sVar7;
  Serializer s;
  Serializer local_40;
  
  if (code->_M_string_length == 0) {
LAB_001ad518:
    currency->pn[0] = 0;
    currency->pn[1] = 0;
    currency->pn[2] = 0;
    currency->pn[3] = 0;
    currency->pn[4] = 0;
    return true;
  }
  if (systemCurrencyCode[abi:cxx11]()::code_abi_cxx11_ == '\0') {
    to_currency();
  }
  iVar5 = std::__cxx11::string::compare((string *)code);
  if (iVar5 == 0) goto LAB_001ad518;
  if (code->_M_string_length == 0x28) {
    bVar4 = base_uint<160UL,_jbcoin::detail::CurrencyTag>::SetHex
                      (currency,(code->_M_dataplus)._M_p,false);
    return bVar4;
  }
  if (code->_M_string_length != 3) {
    return false;
  }
  puVar6 = (undefined1 *)operator_new(3);
  *puVar6 = 0;
  *(undefined2 *)(puVar6 + 1) = 0;
  sVar1 = code->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (code->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      iVar5 = toupper((int)pcVar2[sVar7]);
      puVar6[sVar7] = (char)iVar5;
      sVar7 = sVar7 + 1;
    } while (sVar1 != sVar7);
  }
  Serializer::Serializer(&local_40,0x100);
  Serializer::addZeros(&local_40,0xc);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_40,
             local_40.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish,puVar6,puVar6 + 3);
  Serializer::addZeros(&local_40,2);
  Serializer::addZeros(&local_40,3);
  if ((ulong)((long)local_40.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_40.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) < 0x14) {
    if (local_40.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_001ad567;
  }
  else {
    currency->pn[4] =
         *(uint32_t *)
          (local_40.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 0x10);
    uVar3 = *(undefined8 *)
             (local_40.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start + 8);
    *(undefined8 *)currency->pn =
         *(undefined8 *)
          local_40.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    *(undefined8 *)(currency->pn + 2) = uVar3;
  }
  operator_delete(local_40.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                  (long)local_40.mData.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_40.mData.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
LAB_001ad567:
  operator_delete(puVar6,3);
  return true;
}

Assistant:

bool to_currency(Currency& currency, std::string const& code)
{
    if (code.empty () || !code.compare (systemCurrencyCode()))
    {
        currency = zero;
        return true;
    }

    static const int CURRENCY_CODE_LENGTH = 3;
    if (code.size () == CURRENCY_CODE_LENGTH)
    {
        Blob codeBlob (CURRENCY_CODE_LENGTH);

        std::transform (code.begin (), code.end (), codeBlob.begin (), ::toupper);

        Serializer  s;

        s.addZeros (96 / 8);
        s.addRaw (codeBlob);
        s.addZeros (16 / 8);
        s.addZeros (24 / 8);

        s.get160 (currency, 0);
        return true;
    }

    if (40 == code.size ())
        return currency.SetHex (code);

    return false;
}